

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O0

void __thiscall
NewSymbolTreeVisitor::Visit(NewSymbolTreeVisitor *this,VariableDeclaration *variable_declaration)

{
  NewScopeLayer *pNVar1;
  Type *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  runtime_error *this_00;
  char *pcVar4;
  mapped_type *pmVar5;
  string local_130;
  Symbol local_110;
  allocator<char> local_e9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  string local_d0 [8];
  string new_type_name;
  Symbol local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string *type_name;
  string local_58;
  Symbol local_38;
  VariableDeclaration *local_18;
  VariableDeclaration *variable_declaration_local;
  NewSymbolTreeVisitor *this_local;
  
  pNVar1 = this->current_layer_;
  type = variable_declaration->type_;
  local_18 = variable_declaration;
  variable_declaration_local = (VariableDeclaration *)this;
  std::__cxx11::string::string((string *)&local_58,(string *)&variable_declaration->variable_name_);
  Symbol::Symbol(&local_38,&local_58);
  NewScopeLayer::DeclareVariable(pNVar1,type,&local_38);
  Symbol::~Symbol(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  local_70 = &local_18->type_->type_name_;
  bVar3 = std::operator==(local_70,"void");
  if (bVar3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Can\'t declare variable of void type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar3 = std::operator!=(local_70,"int");
  if ((((bVar3) && (bVar3 = std::operator!=(local_70,"boolean"), bVar3)) &&
      (bVar3 = std::operator!=(local_70,"int[]"), bVar3)) &&
     (bVar3 = std::operator!=(local_70,"boolean[]"), bVar3)) {
    pcVar4 = (char *)std::__cxx11::string::back();
    pbVar2 = local_70;
    if (*pcVar4 == ']') {
      local_d8._M_current = (char *)std::__cxx11::string::begin();
      local_e8._M_current = (char *)std::__cxx11::string::end();
      local_e0 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator-(&local_e8,2);
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                (local_d0,local_d8,local_e0,&local_e9);
      std::allocator<char>::~allocator(&local_e9);
      pNVar1 = this->current_layer_;
      std::__cxx11::string::string((string *)&local_130,(string *)&local_18->variable_name_);
      Symbol::Symbol(&local_110,&local_130);
      pmVar5 = std::
               unordered_map<Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&pNVar1->user_type_system_,&local_110);
      std::__cxx11::string::operator=((string *)pmVar5,local_d0);
      Symbol::~Symbol(&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string(local_d0);
    }
    else {
      pNVar1 = this->current_layer_;
      std::__cxx11::string::string
                ((string *)(new_type_name.field_2._M_local_buf + 8),
                 (string *)&local_18->variable_name_);
      Symbol::Symbol(&local_90,(string *)(new_type_name.field_2._M_local_buf + 8));
      pmVar5 = std::
               unordered_map<Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&pNVar1->user_type_system_,&local_90);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)pbVar2);
      Symbol::~Symbol(&local_90);
      std::__cxx11::string::~string((string *)(new_type_name.field_2._M_local_buf + 8));
    }
  }
  return;
}

Assistant:

void NewSymbolTreeVisitor::Visit(VariableDeclaration* variable_declaration) {
  current_layer_->DeclareVariable(variable_declaration->type_,
                                  Symbol(variable_declaration->variable_name_));

  const std::string& type_name = variable_declaration->type_->type_name_;

  if (type_name == "void") {
    throw std::runtime_error("Can't declare variable of void type");
  }

  // pre type checking to resolve class methods and fields
  if (type_name != "int" && type_name != "boolean" && type_name != "int[]" &&
      type_name != "boolean[]") {
    if (type_name.back() != ']') {
      current_layer_
          ->user_type_system_[Symbol(variable_declaration->variable_name_)] =
          type_name;
    } else {
      std::string new_type_name(type_name.begin(), type_name.end() - 2);

      current_layer_
          ->user_type_system_[Symbol(variable_declaration->variable_name_)] =
          new_type_name;
    }
  }
}